

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintWithoutClosingBenchmarkTable(ConsoleReporter *this)

{
  ConsoleReporter *this_local;
  
  if (((this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used & 1U) ==
      0) {
    lazyPrintRunInfo(this);
  }
  if (((this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.used & 1U) == 0)
  {
    lazyPrintGroupInfo(this);
  }
  if ((this->m_headerPrinted & 1U) == 0) {
    printTestCaseAndSectionHeader(this);
    this->m_headerPrinted = true;
  }
  return;
}

Assistant:

void ConsoleReporter::lazyPrintWithoutClosingBenchmarkTable() {

    if (!currentTestRunInfo.used)
        lazyPrintRunInfo();
    if (!currentGroupInfo.used)
        lazyPrintGroupInfo();

    if (!m_headerPrinted) {
        printTestCaseAndSectionHeader();
        m_headerPrinted = true;
    }
}